

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O2

REF_STATUS
ref_mpi_allconcat(REF_MPI ref_mpi,REF_INT ldim,REF_INT my_size,void *my_array,REF_INT *total_size,
                 REF_INT **source,void **concatenated,REF_TYPE type)

{
  uint uVar1;
  REF_INT *counts;
  long lVar2;
  REF_INT *pRVar3;
  void *concatenated_array;
  uint uVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  
  if ((long)ref_mpi->n < 0) {
    pcVar9 = "malloc counts of REF_INT negative";
    uVar5 = 0x3da;
LAB_001eed35:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar5,
           "ref_mpi_allconcat",pcVar9);
    return 1;
  }
  counts = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (counts == (REF_INT *)0x0) {
    pcVar9 = "malloc counts of REF_INT NULL";
    uVar5 = 0x3da;
LAB_001eed61:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar5,
           "ref_mpi_allconcat",pcVar9);
    return 2;
  }
  *counts = my_size;
  *total_size = 0;
  uVar6 = 0;
  for (lVar2 = 0; uVar1 = ref_mpi->n, lVar2 < (int)uVar1; lVar2 = lVar2 + 1) {
    uVar6 = uVar6 + counts[lVar2];
    *total_size = uVar6;
  }
  if ((int)uVar6 < 0) {
    pcVar9 = "malloc *source of REF_INT negative";
    uVar5 = 0x3e1;
    goto LAB_001eed35;
  }
  pRVar3 = (REF_INT *)malloc((ulong)uVar6 * 4);
  *source = pRVar3;
  if (pRVar3 == (REF_INT *)0x0) {
    pcVar9 = "malloc *source of REF_INT NULL";
    uVar5 = 0x3e1;
    goto LAB_001eed61;
  }
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar4 = 0;
  for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
    lVar2 = (long)(int)uVar4;
    iVar8 = counts[uVar7];
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    uVar4 = uVar4 + iVar8;
    for (; (int)uVar4 != lVar2; lVar2 = lVar2 + 1) {
      pRVar3[lVar2] = (REF_INT)uVar7;
    }
  }
  if (uVar6 != uVar4) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",1000,
           "ref_mpi_allconcat","count mismatch",(ulong)uVar6,(long)(int)uVar4);
    return 1;
  }
  if (type == 3) {
    if ((int)(uVar6 * ldim) < 0) {
      pcVar9 = "malloc *((REF_DBL **)concatenated) of REF_DBL negative";
      uVar5 = 0x3ef;
      goto LAB_001eed35;
    }
    concatenated_array = malloc((ulong)(uVar6 * ldim) << 3);
    *concatenated = concatenated_array;
    if (concatenated_array == (void *)0x0) {
      pcVar9 = "malloc *((REF_DBL **)concatenated) of REF_DBL NULL";
      uVar5 = 0x3ef;
      goto LAB_001eed61;
    }
  }
  else {
    if (type != 1) {
      pcVar9 = "data type";
      uVar6 = 6;
      uVar5 = 0x3f2;
      goto LAB_001eee54;
    }
    if ((int)(uVar6 * ldim) < 0) {
      pcVar9 = "malloc *((REF_INT **)concatenated) of REF_INT negative";
      uVar5 = 0x3ec;
      goto LAB_001eed35;
    }
    concatenated_array = malloc((ulong)(uVar6 * ldim) << 2);
    *concatenated = concatenated_array;
    if (concatenated_array == (void *)0x0) {
      pcVar9 = "malloc *((REF_INT **)concatenated) of REF_INT NULL";
      uVar5 = 0x3ec;
      goto LAB_001eed61;
    }
  }
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    counts[uVar7] = counts[uVar7] * ldim;
  }
  uVar6 = ref_mpi_allgatherv((REF_MPI)(ulong)(uint)ldim,my_array,counts,concatenated_array,type);
  if (uVar6 == 0) {
    free(counts);
    return 0;
  }
  pcVar9 = "gather values";
  uVar5 = 0x3f9;
LAB_001eee54:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar5,
         "ref_mpi_allconcat",(ulong)uVar6,pcVar9);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allconcat(REF_MPI ref_mpi, REF_INT ldim,
                                     REF_INT my_size, void *my_array,
                                     REF_INT *total_size, REF_INT **source,
                                     void **concatenated, REF_TYPE type) {
  REF_INT proc, i, tot;
  REF_INT *counts;

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, (void *)(&my_size), (void *)counts,
                        REF_INT_TYPE),
      "gather size");

  *total_size = 0;
  each_ref_mpi_part(ref_mpi, proc)(*total_size) += counts[proc];
  ref_malloc(*source, *total_size, REF_INT);

  tot = 0;
  each_ref_mpi_part(ref_mpi, proc) for (i = 0; i < counts[proc]; i++) {
    (*source)[tot] = proc;
    tot++;
  }
  REIS(*total_size, tot, "count mismatch");

  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(*((REF_INT **)concatenated), ldim * (*total_size), REF_INT);
      break;
    case REF_DBL_TYPE:
      ref_malloc(*((REF_DBL **)concatenated), ldim * (*total_size), REF_DBL);
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  /* pad ldim */
  each_ref_mpi_part(ref_mpi, proc) counts[proc] *= ldim;

  RSS(ref_mpi_allgatherv(ref_mpi, my_array, counts, *concatenated, type),
      "gather values");

  ref_free(counts);

  return REF_SUCCESS;
}